

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_complexity.c
# Opt level: O1

void av1_setup_in_frame_q_adj(AV1_COMP *cpi)

{
  segmentation *seg;
  int qindex;
  RefCntBuffer *pRVar1;
  int seg_data;
  int16_t iVar2;
  int iVar3;
  long lVar4;
  
  qindex = (cpi->common).quant_params.base_qindex;
  seg = &(cpi->common).seg;
  pRVar1 = (cpi->common).prev_frame;
  if ((pRVar1 != (RefCntBuffer *)0x0) &&
     (((cpi->common).width != pRVar1->width || ((cpi->common).height != pRVar1->height)))) {
    memset((cpi->enc_seg).map,0,
           (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
    av1_clearall_segfeatures(seg);
LAB_003b1b8a:
    av1_disable_segmentation(seg);
    return;
  }
  if ((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
     ((((cpi->common).features.error_resilient_mode != false ||
       ((cpi->refresh_frame).alt_ref_frame != false)) ||
      (((cpi->refresh_frame).golden_frame == true && ((cpi->rc).is_src_frame_alt_ref == 0)))))) {
    iVar2 = av1_ac_quant_QTX(qindex,0,((cpi->common).seq_params)->bit_depth);
    memset((cpi->enc_seg).map,3,
           (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
    av1_clearall_segfeatures(seg);
    if ((cpi->rc).sb64_target_rate < 0x100) goto LAB_003b1b8a;
    av1_enable_segmentation(seg);
    lVar4 = 0;
    av1_disable_segfeature(seg,3,'\0');
    do {
      if (lVar4 != 3) {
        iVar3 = av1_compute_qdelta_by_rate
                          (cpi,(cpi->common).current_frame.frame_type,qindex,
                           *(double *)
                            ((long)aq_c_q_adj_factor[0] +
                            (ulong)(((uint)(0x67 < iVar2) + (uint)(0x2b < iVar2)) * 8) * 5 +
                            lVar4 * 8));
        seg_data = iVar3;
        if (qindex + iVar3 == 0) {
          seg_data = 1 - qindex;
        }
        if (qindex == 0) {
          seg_data = iVar3;
        }
        if (seg_data + qindex != 0 && SCARRY4(seg_data,qindex) == seg_data + qindex < 0) {
          av1_enable_segfeature(seg,(int)lVar4,'\0');
          av1_set_segdata(seg,(int)lVar4,'\0',seg_data);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
  }
  return;
}

Assistant:

void av1_setup_in_frame_q_adj(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  struct segmentation *const seg = &cm->seg;
  const int resolution_change =
      cm->prev_frame && (cm->width != cm->prev_frame->width ||
                         cm->height != cm->prev_frame->height);

  // Make SURE use of floating point in this function is safe.

  if (resolution_change) {
    memset(cpi->enc_seg.map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
    av1_clearall_segfeatures(seg);
    av1_disable_segmentation(seg);
    return;
  }

  if (is_frame_aq_enabled(cpi)) {
    int segment;
    const int aq_strength =
        get_aq_c_strength(base_qindex, cm->seq_params->bit_depth);

    // Clear down the segment map.
    memset(cpi->enc_seg.map, DEFAULT_AQ2_SEG,
           cm->mi_params.mi_rows * cm->mi_params.mi_cols);

    av1_clearall_segfeatures(seg);

    if (!is_sb_aq_enabled(cpi)) {
      av1_disable_segmentation(seg);
      return;
    }

    av1_enable_segmentation(seg);

    // Default segment "Q" feature is disabled so it defaults to the baseline Q.
    av1_disable_segfeature(seg, DEFAULT_AQ2_SEG, SEG_LVL_ALT_Q);

    // Use some of the segments for in frame Q adjustment.
    for (segment = 0; segment < AQ_C_SEGMENTS; ++segment) {
      int qindex_delta;

      if (segment == DEFAULT_AQ2_SEG) continue;

      qindex_delta = av1_compute_qdelta_by_rate(
          cpi, cm->current_frame.frame_type, base_qindex,
          aq_c_q_adj_factor[aq_strength][segment]);

      // For AQ complexity mode, we dont allow Q0 in a segment if the base
      // Q is not 0. Q0 (lossless) implies 4x4 only and in AQ mode 2 a segment
      // Q delta is sometimes applied without going back around the rd loop.
      // This could lead to an illegal combination of partition size and q.
      if ((base_qindex != 0) && ((base_qindex + qindex_delta) == 0)) {
        qindex_delta = -base_qindex + 1;
      }
      if ((base_qindex + qindex_delta) > 0) {
        av1_enable_segfeature(seg, segment, SEG_LVL_ALT_Q);
        av1_set_segdata(seg, segment, SEG_LVL_ALT_Q, qindex_delta);
      }
    }
  }
}